

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O2

int __thiscall
bwtil::fid_cgap::select
          (fid_cgap *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer puVar1;
  pointer puVar2;
  fd_set *__writefds_00;
  ulint uVar3;
  unsigned_long uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  undefined4 in_register_00000034;
  fd_set *__exceptfds_00;
  ulong local_20;
  
  local_20 = CONCAT44(in_register_00000034,__nfds);
  uVar6 = local_20 / this->t;
  puVar1 = (this->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __exceptfds_00 =
       (fd_set *)
       ((long)(this->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
  if ((fd_set *)(uVar6 + 1) < __exceptfds_00) {
    lVar7 = puVar1[uVar6 + 1] + 1;
  }
  else {
    lVar7 = (long)(this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
  }
  _Var8 = ::std::
          __upper_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Val_less_iter>
                    (puVar2 + puVar1[uVar6],puVar2 + lVar7,&local_20);
  __writefds_00 =
       (fd_set *)
       (this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar3 = this->v;
  lVar7 = (long)_Var8._M_current - (long)__writefds_00 >> 3;
  uVar4 = (this->V_select).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start[lVar7 + -1];
  iVar5 = bsd_cgap::select((this->BSDs).
                           super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar7 + -1,
                           (int)local_20 - (int)__writefds_00->fds_bits[lVar7 + -1],
                           (fd_set *)(lVar7 + -1),__writefds_00,__exceptfds_00,__timeout);
  return iVar5 + (int)uVar3 * (int)uVar4;
}

Assistant:

ulint select(ulint i){

		assert(t>0);
		assert(n>0);
		assert(u>0);

		assert(i<n);

		ulint q_l = SEL[i/t];
		ulint q_r = R_1.size();

		if(i/t+1<SEL.size())
			q_r = SEL[i/t+1]+1;

		//i-th bit set is among V-marked blocks q_l,...,q_r
		//note that |{q_l,...,q_r}| <= t, so following binary search costs log t

		assert(q_l<R_1.size());

		ulint q_m = (std::upper_bound(R_1.begin()+q_l,R_1.begin()+q_r,i) - R_1.begin()) - 1;

		assert(R_1[q_m]<=i);

		assert(q_m+1 == R_1.size() || R_1[q_m+1]>i);

		assert(q_m<V_select.size());

		//now V_select[q_m] is the block containing the i-th set bit

		assert(q_m<BSDs.size());
		assert(q_m<R_1.size());
		assert(i>=R_1[q_m]);

		assert(i-R_1[q_m]<BSDs[q_m].number_of_1());

		return V_select[q_m]*v + BSDs[q_m].select(i-R_1[q_m]);

	}